

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O3

void __thiscall FIWadManager::ClearChecks(FIWadManager *this)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  uint amount;
  
  uVar2 = (this->mIWads).Count;
  puVar1 = &(this->mLumpsFound).Count;
  amount = uVar2 - *puVar1;
  if (uVar2 < *puVar1 || amount == 0) {
    (this->mLumpsFound).Count = uVar2;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    TArray<int,_int>::Grow(&this->mLumpsFound,amount);
    (this->mLumpsFound).Count = uVar2;
  }
  piVar3 = (this->mLumpsFound).Array;
  uVar4 = 0;
  do {
    piVar3[uVar4] = 0;
    uVar4 = uVar4 + 1;
  } while (uVar4 < (this->mLumpsFound).Count);
  return;
}

Assistant:

void FIWadManager::ClearChecks()
{
	mLumpsFound.Resize(mIWads.Size());
	for(unsigned i=0;i<mLumpsFound.Size(); i++)
	{
		mLumpsFound[i] = 0;
	}
}